

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O0

int ccall_struct_reg(CCallState *cc,CTState *cts,GPRArg *dp,int *rcl)

{
  uint32_t i;
  MSize nfpr;
  MSize ngpr;
  int *rcl_local;
  GPRArg *dp_local;
  CTState *cts_local;
  CCallState *cc_local;
  
  ngpr = (MSize)cc->ngpr;
  nfpr = (MSize)cc->nfpr;
  i = 0;
  do {
    if (1 < i) {
      cc->ngpr = (uint8_t)ngpr;
      cc->nfpr = (uint8_t)nfpr;
      return 0;
    }
    if ((rcl[i] & 1U) == 0) {
      if ((rcl[i] & 2U) != 0) {
        if (7 < nfpr) {
          return 1;
        }
        cc->fpr[nfpr].d[0] = (double)dp[i];
        nfpr = nfpr + 1;
      }
    }
    else {
      if (5 < ngpr) {
        return 1;
      }
      cc->gpr[ngpr] = dp[i];
      ngpr = ngpr + 1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

static int ccall_struct_reg(CCallState *cc, CTState *cts, GPRArg *dp, int *rcl)
{
  MSize ngpr = cc->ngpr, nfpr = cc->nfpr;
  uint32_t i;
  UNUSED(cts);
  for (i = 0; i < 2; i++) {
    lj_assertCTS(!(rcl[i] & CCALL_RCL_MEM), "pass mem struct in reg");
    if ((rcl[i] & CCALL_RCL_INT)) {  /* Integer class takes precedence. */
      if (ngpr >= CCALL_NARG_GPR) return 1;  /* Register overflow. */
      cc->gpr[ngpr++] = dp[i];
    } else if ((rcl[i] & CCALL_RCL_SSE)) {
      if (nfpr >= CCALL_NARG_FPR) return 1;  /* Register overflow. */
      cc->fpr[nfpr++].l[0] = dp[i];
    }
  }
  cc->ngpr = ngpr; cc->nfpr = nfpr;
  return 0;  /* Ok. */
}